

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

IOStream * __thiscall
Assimp::ZipArchiveIOSystem::Open(ZipArchiveIOSystem *this,char *pFilename,char *pMode)

{
  IOStream *pIVar1;
  allocator local_51;
  undefined1 local_50 [8];
  string filename;
  size_t i;
  char *pMode_local;
  char *pFilename_local;
  ZipArchiveIOSystem *this_local;
  
  if (pFilename == (char *)0x0) {
    __assert_fail("pFilename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x1f5,
                  "virtual IOStream *Assimp::ZipArchiveIOSystem::Open(const char *, const char *)");
  }
  filename.field_2._8_8_ = 0;
  while( true ) {
    if (pMode[filename.field_2._8_8_] == '\0') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_50,pFilename,&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      pIVar1 = Implement::OpenFile(this->pImpl,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      return pIVar1;
    }
    if (pMode[filename.field_2._8_8_] == 'w') break;
    if (pMode[filename.field_2._8_8_] == 'w') {
      return (IOStream *)0x0;
    }
    filename.field_2._8_8_ = filename.field_2._8_8_ + 1;
  }
  __assert_fail("pMode[i] != \'w\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0x1f9,
                "virtual IOStream *Assimp::ZipArchiveIOSystem::Open(const char *, const char *)");
}

Assistant:

IOStream * ZipArchiveIOSystem::Open(const char* pFilename, const char* pMode) {
        ai_assert(pFilename != nullptr);

        for (size_t i = 0; pMode[i] != 0; ++i)
        {
            ai_assert(pMode[i] != 'w');
            if (pMode[i] == 'w')
                return nullptr;
        }

        std::string filename(pFilename);
        return pImpl->OpenFile(filename);
    }